

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRNetClient.cpp
# Opt level: O1

VRDataQueue * __thiscall
MinVR::VRNetClient::syncEventDataAcrossAllNodes
          (VRDataQueue *__return_storage_ptr__,VRNetClient *this,VRDataQueue *eventQueue)

{
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar1;
  serialData allEventData;
  serialData local_80;
  serialData local_60;
  serialData local_40;
  
  iVar1 = this->_socketFD;
  VRDataQueue::serialize_abi_cxx11_(&local_40,eventQueue);
  VRNetInterface::sendEventData(iVar1,&local_40);
  iVar1 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    iVar1 = extraout_EDX_00;
  }
  VRNetInterface::waitForAndReceiveEventData_abi_cxx11_
            (&local_60,(VRNetInterface *)(ulong)(uint)this->_socketFD,iVar1);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,local_60._M_dataplus._M_p,
             local_60._M_dataplus._M_p + local_60._M_string_length);
  VRDataQueue::VRDataQueue(__return_storage_ptr__,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

VRDataQueue VRNetClient::syncEventDataAcrossAllNodes(VRDataQueue eventQueue) {

  // 1. send inputEvents to server
  sendEventData(_socketFD, eventQueue.serialize());

  // 2. receive all events from the server
  VRDataQueue::serialData allEventData = waitForAndReceiveEventData(_socketFD);

  return VRDataQueue(allEventData);
}